

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

bool __thiscall crnlib::crn_comp::compress_internal(crn_comp *this)

{
  vector<unsigned_short> *pvVar1;
  vector<unsigned_short> *pvVar2;
  uint *puVar3;
  uchar *puVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  crn_bool cVar8;
  vector<unsigned_short> *pAlpha_endpoint_remap;
  crn_comp_params *pcVar9;
  ulong uVar10;
  vector<unsigned_short> *pvVar11;
  vector<unsigned_short> *pColor_selector_remap;
  vector<unsigned_short> *pAlpha_selector_remap;
  symbol_histogram *psVar12;
  symbol_codec *pCodec;
  long lVar13;
  uint *puVar14;
  bool bVar15;
  symbol_codec local_c8;
  
  bVar7 = alias_images(this);
  if ((bVar7) && (bVar7 = quantize_images(this), bVar7)) {
    puVar3 = (this->m_reference_hist).m_hist.m_p;
    if (puVar3 != (uint *)0x0) {
      crnlib_free(puVar3);
      (this->m_reference_hist).m_hist.m_p = (uint *)0x0;
      (this->m_reference_hist).m_hist.m_size = 0;
      (this->m_reference_hist).m_hist.m_capacity = 0;
    }
    pvVar1 = this->m_endpoint_remaping;
    pvVar2 = this->m_selector_remaping;
    lVar13 = 0;
    bVar7 = true;
    do {
      bVar15 = bVar7;
      if (pvVar1[lVar13].m_p != (unsigned_short *)0x0) {
        pvVar11 = pvVar1 + lVar13;
        crnlib_free(pvVar1[lVar13].m_p);
        pvVar11->m_p = (unsigned_short *)0x0;
        pvVar11->m_size = 0;
        pvVar11->m_capacity = 0;
      }
      puVar3 = this->m_endpoint_index_hist[lVar13].m_hist.m_p;
      if (puVar3 != (uint *)0x0) {
        psVar12 = this->m_endpoint_index_hist + lVar13;
        crnlib_free(puVar3);
        (psVar12->m_hist).m_p = (uint *)0x0;
        (psVar12->m_hist).m_size = 0;
        (psVar12->m_hist).m_capacity = 0;
      }
      static_huffman_data_model::clear
                ((static_huffman_data_model *)
                 ((long)this->m_endpoint_index_hist + lVar13 * 0x38 + 0x20));
      if (pvVar2[lVar13].m_p != (unsigned_short *)0x0) {
        pvVar11 = pvVar2 + lVar13;
        crnlib_free(pvVar2[lVar13].m_p);
        pvVar11->m_p = (unsigned_short *)0x0;
        pvVar11->m_size = 0;
        pvVar11->m_capacity = 0;
      }
      puVar3 = this->m_selector_index_hist[lVar13].m_hist.m_p;
      if (puVar3 != (uint *)0x0) {
        psVar12 = this->m_selector_index_hist + lVar13;
        crnlib_free(puVar3);
        (psVar12->m_hist).m_p = (uint *)0x0;
        (psVar12->m_hist).m_size = 0;
        (psVar12->m_hist).m_capacity = 0;
      }
      static_huffman_data_model::clear
                ((static_huffman_data_model *)
                 ((long)this->m_selector_index_hist + lVar13 * 0x38 + 0x20));
      lVar13 = 1;
      bVar7 = false;
    } while (bVar15);
    if (this->m_has_comp[0] != false) {
      optimize_color(this);
    }
    if (this->m_has_comp[1] == true) {
      optimize_alpha(this);
    }
    bVar7 = false;
    bVar15 = true;
    do {
      bVar6 = bVar15;
      if ((this->m_levels).m_size != 0) {
        pCodec = &local_c8;
        if (bVar6) {
          pCodec = (symbol_codec *)0x0;
        }
        uVar10 = 0;
        puVar14 = &this->m_packed_blocks[0].m_size;
        do {
          symbol_codec::symbol_codec(&local_c8);
          symbol_codec::start_encoding(&local_c8,0x200000);
          bVar15 = this->m_has_comp[0] != false;
          pvVar11 = (vector<unsigned_short> *)0x0;
          if (bVar15) {
            pvVar11 = pvVar1;
          }
          pColor_selector_remap = (vector<unsigned_short> *)0x0;
          if (bVar15) {
            pColor_selector_remap = pvVar2;
          }
          bVar15 = this->m_has_comp[1] != false;
          pAlpha_endpoint_remap = (vector<unsigned_short> *)0x0;
          if (bVar15) {
            pAlpha_endpoint_remap = this->m_endpoint_remaping + 1;
          }
          pAlpha_selector_remap = (vector<unsigned_short> *)0x0;
          if (bVar15) {
            pAlpha_selector_remap = this->m_selector_remaping + 1;
          }
          pack_blocks(this,(uint)uVar10,!bVar7 && (uint)uVar10 == 0,pCodec,pvVar11,
                      pColor_selector_remap,pAlpha_endpoint_remap,pAlpha_selector_remap);
          symbol_codec::stop_encoding(&local_c8,false);
          if (!bVar6) {
            puVar4 = ((vector<unsigned_char> *)(puVar14 + -2))->m_p;
            ((vector<unsigned_char> *)(puVar14 + -2))->m_p = local_c8.m_output_buf.m_p;
            uVar5 = *(undefined8 *)puVar14;
            *(undefined8 *)puVar14 = local_c8.m_output_buf._8_8_;
            local_c8.m_output_buf.m_p = puVar4;
            local_c8.m_output_buf._8_8_ = uVar5;
          }
          if (local_c8.m_output_syms.m_p != (output_symbol *)0x0) {
            crnlib_free(local_c8.m_output_syms.m_p);
          }
          if (local_c8.m_arith_output_buf.m_p != (uchar *)0x0) {
            crnlib_free(local_c8.m_arith_output_buf.m_p);
          }
          if (local_c8.m_output_buf.m_p != (uchar *)0x0) {
            crnlib_free(local_c8.m_output_buf.m_p);
          }
          uVar10 = uVar10 + 1;
          puVar14 = puVar14 + 4;
        } while (uVar10 < (this->m_levels).m_size);
      }
      if (!bVar6) break;
      static_huffman_data_model::init(&this->m_reference_dm,(EVP_PKEY_CTX *)0x1);
      lVar13 = 0;
      bVar7 = true;
      do {
        bVar15 = bVar7;
        if (this->m_endpoint_index_hist[lVar13].m_hist.m_size != 0) {
          static_huffman_data_model::init
                    ((static_huffman_data_model *)
                     ((long)this->m_endpoint_index_hist + lVar13 * 0x38 + 0x20),(EVP_PKEY_CTX *)0x1)
          ;
        }
        if (this->m_selector_index_hist[lVar13].m_hist.m_size != 0) {
          static_huffman_data_model::init
                    ((static_huffman_data_model *)
                     ((long)this->m_selector_index_hist + lVar13 * 0x38 + 0x20),(EVP_PKEY_CTX *)0x1)
          ;
        }
        lVar13 = 1;
        bVar7 = false;
      } while (bVar15);
      bVar7 = true;
      bVar15 = false;
    } while (bVar6);
    bVar7 = pack_data_models(this);
    if (bVar7) {
      create_comp_data(this);
      pcVar9 = this->m_pParams;
      if (pcVar9->m_pProgress_func != (crn_progress_callback_func)0x0) {
        cVar8 = (*pcVar9->m_pProgress_func)(0x18,0x19,1,1,pcVar9->m_pProgress_func_data);
        if (cVar8 == 0) {
          return false;
        }
        pcVar9 = this->m_pParams;
      }
      if ((int)pcVar9->m_flags < 0) {
        crnlib_print_mem_stats();
        return true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool crn_comp::compress_internal()
    {
        if (!alias_images())
        {
            return false;
        }
        if (!quantize_images())
        {
            return false;
        }

        m_reference_hist.clear();
        for (uint i = 0; i < 2; i++)
        {
            m_endpoint_remaping[i].clear();
            m_endpoint_index_hist[i].clear();
            m_endpoint_index_dm[i].clear();
            m_selector_remaping[i].clear();
            m_selector_index_hist[i].clear();
            m_selector_index_dm[i].clear();
        }

        if (m_has_comp[cColor])
        {
            optimize_color();
        }

        if (m_has_comp[cAlpha0])
        {
            optimize_alpha();
        }

        for (uint pass = 0; pass < 2; pass++)
        {
            for (uint level = 0; level < m_levels.size(); level++)
            {
                symbol_codec codec;
                codec.start_encoding(2 * 1024 * 1024);

                if (!pack_blocks(
                        level,
                        !pass && !level, pass ? &codec : nullptr,
                        m_has_comp[cColor] ? &m_endpoint_remaping[cColor] : nullptr, m_has_comp[cColor] ? &m_selector_remaping[cColor] : nullptr,
                        m_has_comp[cAlpha0] ? &m_endpoint_remaping[cAlpha0] : nullptr, m_has_comp[cAlpha0] ? &m_selector_remaping[cAlpha0] : nullptr))
                {
                    return false;
                }

                codec.stop_encoding(false);

                if (pass)
                {
                    m_packed_blocks[level].swap(codec.get_encoding_buf());
                }
            }

            if (!pass)
            {
                m_reference_dm.init(true, m_reference_hist, 16);

                for (uint i = 0; i < 2; i++)
                {
                    if (m_endpoint_index_hist[i].size())
                    {
                        m_endpoint_index_dm[i].init(true, m_endpoint_index_hist[i], 16);
                    }

                    if (m_selector_index_hist[i].size())
                    {
                        m_selector_index_dm[i].init(true, m_selector_index_hist[i], 16);
                    }
                }
            }
        }

        if (!pack_data_models())
        {
            return false;
        }

        if (!create_comp_data())
        {
            return false;
        }

        if (!update_progress(24, 1, 1))
        {
            return false;
        }

        if (m_pParams->m_flags & cCRNCompFlagDebugging)
        {
            crnlib_print_mem_stats();
        }

        return true;
    }